

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

ssize_t __thiscall covenant::CFG::write(CFG *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  uint vv;
  ulong uVar2;
  undefined4 in_register_00000034;
  ostream *o;
  
  o = (ostream *)CONCAT44(in_register_00000034,__fd);
  poVar1 = std::operator<<(o,"start symbol: ");
  poVar1 = operator<<(poVar1,(Sym)(this->start * 2 + 1));
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)(this->prods).
                             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->prods).
                            super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      uVar2 = (ulong)((uint)uVar2 + 1)) {
    printProduction(this,o,(uint)uVar2);
  }
  return (ssize_t)o;
}

Assistant:

ostream & write(ostream &o) const 
    {
      o << "start symbol: " << startSym () << endl;
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        printProduction(o, vv);
      }
      return o;
    }